

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_next_subscription_sync_may_combine_subscription_set_deletions_with_controls_Test
::TestBody(SubjectSetRegisterTest_next_subscription_sync_may_combine_subscription_set_deletions_with_controls_Test
           *this)

{
  allocator<bidfx_public_api::price::subject::Subject> *paVar1;
  initializer_list<bidfx_public_api::price::subject::Subject> __l;
  initializer_list<bidfx_public_api::price::subject::Subject> __l_00;
  bool bVar2;
  byte bVar3;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  *pvVar4;
  char *pcVar5;
  map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
  *pmVar6;
  pointer ppVar7;
  map<bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>_>
  *pmVar8;
  char *in_R9;
  Subject *local_4c8;
  Subject *local_468;
  AssertHelper local_458;
  Message local_450;
  _Rb_tree_iterator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>
  local_448;
  _Rb_tree_iterator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>
  local_440;
  undefined1 local_438 [8];
  AssertionResult gtest_ar_3;
  Message local_420;
  key_type_conflict local_414;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>
  local_410;
  ControlOperationEnum local_404;
  undefined1 local_400 [8];
  AssertionResult gtest_ar_2;
  map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
  controls;
  Message local_3b8;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_380;
  Message local_378;
  bool local_369;
  undefined1 local_368 [8];
  AssertionResult gtest_ar_;
  Subject local_348 [24];
  Subject local_330 [24];
  Subject local_318 [24];
  iterator local_300;
  size_type local_2f8;
  undefined1 local_2f0 [8];
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  subjects_set2;
  optional<bidfx_public_api::price::pixie::SubscriptionSync> message;
  Subject local_250 [24];
  AssertHelper local_238;
  Message local_230;
  optional<bidfx_public_api::price::pixie::SubscriptionSync> local_228;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar;
  Subject local_198 [24];
  Subject local_180 [24];
  Subject local_168 [24];
  Subject local_150 [24];
  iterator local_138;
  size_type local_130;
  undefined1 local_128 [8];
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  subjects_set1;
  Subject local_f8 [24];
  Subject local_e0 [40];
  Subject local_b8 [24];
  SubjectSetRegister local_a0 [8];
  SubjectSetRegister subject_register;
  SubjectSetRegisterTest_next_subscription_sync_may_combine_subscription_set_deletions_with_controls_Test
  *this_local;
  
  bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetRegister(local_a0);
  bidfx_public_api::price::subject::Subject::Subject(local_b8,(Subject *)SS_SUBJECT0);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_a0,local_b8,0);
  subject::Subject::~Subject(local_b8);
  bidfx_public_api::price::subject::Subject::Subject(local_e0,(Subject *)SS_RFS_SUBJECT1);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_a0,local_e0,0);
  subject::Subject::~Subject(local_e0);
  bidfx_public_api::price::subject::Subject::Subject(local_f8,(Subject *)SS_SUBJECT2);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_a0,local_f8,0);
  subject::Subject::~Subject(local_f8);
  bidfx_public_api::price::subject::Subject::Subject
            ((Subject *)
             &subjects_set1.
              super__Vector_base<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Subject *)SS_RFQ_SUBJECT3);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register
            (local_a0,&subjects_set1.
                       super__Vector_base<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  subject::Subject::~Subject
            ((Subject *)
             &subjects_set1.
              super__Vector_base<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  bidfx_public_api::price::subject::Subject::Subject(local_198,(Subject *)SS_SUBJECT0);
  bidfx_public_api::price::subject::Subject::Subject(local_180,(Subject *)SS_SUBJECT1);
  bidfx_public_api::price::subject::Subject::Subject(local_168,(Subject *)SS_SUBJECT2);
  bidfx_public_api::price::subject::Subject::Subject(local_150,(Subject *)SS_RFQ_SUBJECT3);
  local_138 = local_198;
  local_130 = 4;
  paVar1 = (allocator<bidfx_public_api::price::subject::Subject> *)
           ((long)&gtest_ar.message_.ptr_ + 7);
  std::allocator<bidfx_public_api::price::subject::Subject>::allocator(paVar1);
  __l_00._M_len = local_130;
  __l_00._M_array = local_138;
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::vector((vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
            *)local_128,__l_00,paVar1);
  std::allocator<bidfx_public_api::price::subject::Subject>::~allocator
            ((allocator<bidfx_public_api::price::subject::Subject> *)
             ((long)&gtest_ar.message_.ptr_ + 7));
  local_468 = (Subject *)&local_138;
  do {
    local_468 = local_468 + -0x18;
    subject::Subject::~Subject(local_468);
  } while (local_468 != local_198);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::operator->(&local_228);
  pvVar4 = (vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
            *)bidfx_public_api::price::pixie::SubscriptionSync::GetSubjects();
  testing::internal::EqHelper<false>::
  Compare<std::vector<bidfx_public_api::price::subject::Subject,std::allocator<bidfx_public_api::price::subject::Subject>>,std::vector<bidfx_public_api::price::subject::Subject,std::allocator<bidfx_public_api::price::subject::Subject>>>
            ((EqHelper<false> *)local_1b8,"subjects_set1",
             "subject_register.NextSubscriptionSync()->GetSubjects()",
             (vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
              *)local_128,pvVar4);
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::~optional(&local_228);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar2) {
    testing::Message::Message(&local_230);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x312,pcVar5);
    testing::internal::AssertHelper::operator=(&local_238,&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  bidfx_public_api::price::subject::Subject::Subject(local_250,(Subject *)SS_SUBJECT1);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_a0,local_250,1);
  subject::Subject::~Subject(local_250);
  bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)local_a0);
  bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)local_a0);
  bidfx_public_api::price::subject::Subject::Subject
            ((Subject *)
             &message.
              super__Optional_base<bidfx_public_api::price::pixie::SubscriptionSync,_false,_false>.
              _M_payload.
              super__Optional_payload<bidfx_public_api::price::pixie::SubscriptionSync,_true,_false,_false>
              .super__Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>.
              _M_engaged,(Subject *)SS_RFQ_SUBJECT3);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register
            (local_a0,&message.
                       super__Optional_base<bidfx_public_api::price::pixie::SubscriptionSync,_false,_false>
                       ._M_payload.
                       super__Optional_payload<bidfx_public_api::price::pixie::SubscriptionSync,_true,_false,_false>
                       .
                       super__Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>
                       ._M_engaged,0);
  subject::Subject::~Subject
            ((Subject *)
             &message.
              super__Optional_base<bidfx_public_api::price::pixie::SubscriptionSync,_false,_false>.
              _M_payload.
              super__Optional_payload<bidfx_public_api::price::pixie::SubscriptionSync,_true,_false,_false>
              .super__Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>.
              _M_engaged);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  bidfx_public_api::price::subject::Subject::Subject(local_348,(Subject *)SS_RFS_SUBJECT1);
  bidfx_public_api::price::subject::Subject::Subject(local_330,(Subject *)SS_SUBJECT2);
  bidfx_public_api::price::subject::Subject::Subject(local_318,(Subject *)SS_RFQ_SUBJECT3);
  local_300 = local_348;
  local_2f8 = 3;
  paVar1 = (allocator<bidfx_public_api::price::subject::Subject> *)
           ((long)&gtest_ar_.message_.ptr_ + 7);
  std::allocator<bidfx_public_api::price::subject::Subject>::allocator(paVar1);
  __l._M_len = local_2f8;
  __l._M_array = local_300;
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::vector((vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
            *)local_2f0,__l,paVar1);
  std::allocator<bidfx_public_api::price::subject::Subject>::~allocator
            ((allocator<bidfx_public_api::price::subject::Subject> *)
             ((long)&gtest_ar_.message_.ptr_ + 7));
  local_4c8 = (Subject *)&local_300;
  do {
    local_4c8 = local_4c8 + -0x18;
    subject::Subject::~Subject(local_4c8);
  } while (local_4c8 != local_348);
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::operator->
            ((optional<bidfx_public_api::price::pixie::SubscriptionSync> *)
             &subjects_set2.
              super__Vector_base<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  bVar3 = bidfx_public_api::price::pixie::SubscriptionSync::IsChangedEdition();
  local_369 = (bool)(bVar3 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_368,&local_369,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_368);
  if (!bVar2) {
    testing::Message::Message(&local_378);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_368,
               (AssertionResult *)"message->IsChangedEdition()","false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x31b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_380,&local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_378);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_368);
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::operator->
            ((optional<bidfx_public_api::price::pixie::SubscriptionSync> *)
             &subjects_set2.
              super__Vector_base<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pvVar4 = (vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
            *)bidfx_public_api::price::pixie::SubscriptionSync::GetSubjects();
  testing::internal::EqHelper<false>::
  Compare<std::vector<bidfx_public_api::price::subject::Subject,std::allocator<bidfx_public_api::price::subject::Subject>>,std::vector<bidfx_public_api::price::subject::Subject,std::allocator<bidfx_public_api::price::subject::Subject>>>
            ((EqHelper<false> *)local_3b0,"subjects_set2","message->GetSubjects()",
             (vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
              *)local_2f0,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
  if (!bVar2) {
    testing::Message::Message(&local_3b8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_3b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&controls._M_t._M_impl.super__Rb_tree_header._M_node_count,
               kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x31c,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&controls._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_3b8
              );
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)&controls._M_t._M_impl.super__Rb_tree_header._M_node_count);
    testing::Message::~Message(&local_3b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::operator->
            ((optional<bidfx_public_api::price::pixie::SubscriptionSync> *)
             &subjects_set2.
              super__Vector_base<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pmVar6 = (map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
            *)bidfx_public_api::price::pixie::SubscriptionSync::GetControls();
  std::
  map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
  ::map((map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
         *)&gtest_ar_2.message_,pmVar6);
  local_404 = REFRESH;
  local_414 = 0;
  local_410._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
       ::find((map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
               *)&gtest_ar_2.message_,&local_414);
  ppVar7 = std::
           _Rb_tree_iterator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>
           ::operator->(&local_410);
  testing::internal::EqHelper<false>::
  Compare<bidfx_public_api::price::pixie::ControlOperationEnum,bidfx_public_api::price::pixie::ControlOperationEnum>
            ((EqHelper<false> *)local_400,"ControlOperationEnum::REFRESH","controls.find(0)->second"
             ,&local_404,&ppVar7->second);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_400);
  if (!bVar2) {
    testing::Message::Message(&local_420);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_400);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,799,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_420);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_420);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_400);
  pmVar8 = (map<bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>_>
            *)bidfx_public_api::price::pixie::SubjectSetRegister::GetSubjectState();
  local_440._M_node =
       (_Base_ptr)
       std::
       map<bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>_>
       ::end(pmVar8);
  pmVar8 = (map<bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>_>
            *)bidfx_public_api::price::pixie::SubjectSetRegister::GetSubjectState();
  local_448._M_node =
       (_Base_ptr)
       std::
       map<bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>_>
       ::find(pmVar8,(key_type *)SS_SUBJECT0);
  testing::internal::EqHelper<false>::
  Compare<std::_Rb_tree_iterator<std::pair<bidfx_public_api::price::subject::Subject_const,bidfx_public_api::price::pixie::SubjectState>>,std::_Rb_tree_iterator<std::pair<bidfx_public_api::price::subject::Subject_const,bidfx_public_api::price::pixie::SubjectState>>>
            ((EqHelper<false> *)local_438,"subject_register.GetSubjectState().end()",
             "subject_register.GetSubjectState().find(SS_SUBJECT0)",&local_440,&local_448);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_438);
  if (!bVar2) {
    testing::Message::Message(&local_450);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_438);
    testing::internal::AssertHelper::AssertHelper
              (&local_458,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x321,pcVar5);
    testing::internal::AssertHelper::operator=(&local_458,&local_450);
    testing::internal::AssertHelper::~AssertHelper(&local_458);
    testing::Message::~Message(&local_450);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_438);
  std::
  map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
  ::~map((map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
          *)&gtest_ar_2.message_);
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::~vector((vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
             *)local_2f0);
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::~optional
            ((optional<bidfx_public_api::price::pixie::SubscriptionSync> *)
             &subjects_set2.
              super__Vector_base<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::~vector((vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
             *)local_128);
  SubjectSetRegister::~SubjectSetRegister(local_a0);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, next_subscription_sync_may_combine_subscription_set_deletions_with_controls)
{
    SubjectSetRegister subject_register = SubjectSetRegister();
    subject_register.Register(SS_SUBJECT0, false);
    subject_register.Register(SS_RFS_SUBJECT1, false);
    subject_register.Register(SS_SUBJECT2, false);
    subject_register.Register(SS_RFQ_SUBJECT3, false);
    std::vector<Subject> subjects_set1 = {SS_SUBJECT0, SS_SUBJECT1, SS_SUBJECT2, SS_RFQ_SUBJECT3};
    EXPECT_EQ(subjects_set1, subject_register.NextSubscriptionSync()->GetSubjects());

    subject_register.Register(SS_SUBJECT1, true); // forces refresh
    subject_register.Unregister(SS_SUBJECT0); // new addition to subscription set
    subject_register.Unregister(SS_RFQ_SUBJECT3);
    subject_register.Register(SS_RFQ_SUBJECT3, false); // forces toggle unsubscribe and subscribe

    std::optional<SubscriptionSync> message = subject_register.NextSubscriptionSync();
    std::vector<Subject> subjects_set2 = {SS_RFS_SUBJECT1, SS_SUBJECT2, SS_RFQ_SUBJECT3};
    EXPECT_TRUE(message->IsChangedEdition());
    EXPECT_EQ(subjects_set2, message->GetSubjects());

    auto controls = message->GetControls();
    EXPECT_EQ(ControlOperationEnum::REFRESH, controls.find(0)->second);

    EXPECT_EQ(subject_register.GetSubjectState().end(), subject_register.GetSubjectState().find(SS_SUBJECT0));
}